

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void detail::do_deserialize<std::__cxx11::list<int,std::allocator<int>>>
               (long container,long *buffer)

{
  _List_node_base *p_Var1;
  long lVar2;
  
  lVar2 = *(long *)*buffer;
  *buffer = (long)((long *)*buffer + 1);
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    p_Var1 = (_List_node_base *)operator_new(0x18);
    *(undefined4 *)&p_Var1[1]._M_next = 0;
    std::__detail::_List_node_base::_M_hook(p_Var1);
    *(long *)(container + 0x10) = *(long *)(container + 0x10) + 1;
    *(undefined4 *)(*(long *)(container + 8) + 0x10) = *(undefined4 *)*buffer;
    *buffer = *buffer + 4;
  }
  return;
}

Assistant:

void do_deserialize(T& value, span<std::byte const>& buffer, value_tag<serialization_category::trivial>) noexcept {
        memcpy(&value, buffer.data(), sizeof(T));
        buffer.begin() += sizeof(T);
    }